

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

void __thiscall
covenant::DFA<covenant::Sym>::transition(DFA<covenant::Sym> *this,State s,Sym *val,State r)

{
  pointer pvVar1;
  _Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
  local_48;
  
  while (pvVar1 = (this->trans).
                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (ulong)(((long)(this->trans).
                       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <=
        (ulong)s.id) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>,std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>>>
    ::
    emplace_back<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>>
              ((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>,std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>>>
                *)&this->trans,
               (vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                *)&local_48);
    std::
    _Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
    ::~_Vector_base(&local_48);
  }
  local_48._M_impl.super__Vector_impl_data._M_start._4_4_ = r.id;
  local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = val->x;
  std::
  vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>::
  emplace_back<covenant::DFA<covenant::Sym>::Edge>
            (pvVar1 + s.id,(anon_struct_8_2_19f0db9c *)&local_48);
  return;
}

Assistant:

void transition(State s, const V& val, State r) 
    {
      while( s.id >= trans.size() )
        trans.push_back( vector<Edge>() );
      
      trans[s.id].push_back( mk_edge(val, r.id) );
    }